

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::BufferSubData::BufferSubData
          (BufferSubData *this,SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer,GLenum target,
          GLintptr offset,GLsizeiptr size,bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_38;
  
  Operation::Operation(&this->super_Operation,"BufferSubData",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__BufferSubData_003ead60;
  (this->m_buffer).m_ptr = buffer->m_ptr;
  pSVar2 = buffer->m_state;
  (this->m_buffer).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_buffer).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  this->m_target = target;
  this->m_offset = offset;
  this->m_size = size;
  local_38.m_ptr = &((this->m_buffer).m_ptr)->super_Object;
  local_38.m_state = (this->m_buffer).m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_38);
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.m_ptr = (Object *)0x0;
      (*(local_38.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_38.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_38.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_38.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

BufferSubData::BufferSubData (SharedPtr<Buffer> buffer, GLenum target, GLintptr offset, GLsizeiptr size, bool useSync, bool serverSync)
	: Operation	("BufferSubData", useSync, serverSync)
	, m_buffer	(buffer)
	, m_target	(target)
	, m_offset	(offset)
	, m_size	(size)
{
	modifyGLObject(SharedPtr<Object>(m_buffer));
}